

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::LimitingInputStream::Next(LimitingInputStream *this,void **data,int *size)

{
  ulong uVar1;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x10) < 1) {
    local_1 = false;
  }
  else {
    uVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),in_RSI,in_RDX);
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - (long)*in_RDX;
      if (*(long *)(in_RDI + 0x10) < 0) {
        *in_RDX = *in_RDX + (int)*(undefined8 *)(in_RDI + 0x10);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool LimitingInputStream::Next(const void** data, int* size) {
  if (limit_ <= 0) return false;
  if (!input_->Next(data, size)) return false;

  limit_ -= *size;
  if (limit_ < 0) {
    // We overshot the limit.  Reduce *size to hide the rest of the buffer.
    *size += limit_;
  }
  return true;
}